

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labels_solver.h
# Opt level: O1

uint UF::MemMerge(uint i,uint j)

{
  pointer puVar1;
  pointer piVar2;
  int *piVar3;
  uint *puVar4;
  int iVar5;
  int *piVar6;
  uint *puVar7;
  
  piVar2 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start + (int)i;
  iVar5 = *piVar3;
  *piVar3 = iVar5 + 1;
  puVar4 = puVar1 + (int)i;
  if (*puVar4 < i) {
    do {
      *piVar3 = iVar5 + 2;
      i = *puVar4;
      piVar3 = piVar2 + (int)i;
      iVar5 = *piVar3;
      *piVar3 = iVar5 + 1;
      puVar4 = puVar1 + (int)i;
    } while (*puVar4 < i);
  }
  piVar6 = piVar2 + (int)j;
  iVar5 = *piVar6;
  *piVar6 = iVar5 + 1;
  puVar7 = puVar1 + (int)j;
  if (*puVar7 < j) {
    do {
      *piVar6 = iVar5 + 2;
      j = *puVar7;
      piVar6 = piVar2 + (int)j;
      iVar5 = *piVar6;
      *piVar6 = iVar5 + 1;
      puVar7 = puVar1 + (int)j;
    } while (*puVar7 < j);
  }
  if (i < j) {
    *piVar6 = iVar5 + 2;
    *puVar7 = i;
    j = i;
  }
  else {
    *piVar3 = *piVar3 + 1;
    *puVar4 = j;
  }
  return j;
}

Assistant:

static unsigned MemMerge(unsigned i, unsigned j)
    {
        // FindRoot(i)
        while (mem_P_[i] < i) {
            i = mem_P_[i];
        }

        // FindRoot(j)
        while (mem_P_[j] < j) {
            j = mem_P_[j];
        }

        if (i < j)
            return mem_P_[j] = i;
        return mem_P_[i] = j;
    }